

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ospf-packet.cc
# Opt level: O2

void __thiscall NetworkLsa::NetworkLsa(NetworkLsa *this,istream *is)

{
  uint16_t uVar1;
  uint64_t uVar2;
  short sVar3;
  uint8_t arr [4];
  uint local_3c;
  NetworkLsa *local_38;
  
  Lsa::Lsa(&this->super_Lsa,is);
  (this->super_Lsa)._vptr_Lsa = (_func_int **)&PTR__NetworkLsa_0012a500;
  (this->attach_routers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attach_routers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attach_routers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (this->super_Lsa).tlen;
  local_38 = this;
  std::istream::read((char *)is,(long)arr);
  uVar2 = arr2num(arr,'\x04');
  *(int *)&(local_38->super_Lsa).field_0x2c = (int)uVar2;
  for (sVar3 = uVar1 - 0x18; sVar3 != 0; sVar3 = sVar3 + -4) {
    std::istream::read((char *)is,(long)arr);
    uVar2 = arr2num(arr,'\x04');
    local_3c = (uint)uVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->attach_routers,&local_3c);
  }
  local_38->attach_num =
       (uint32_t)
       ((ulong)((long)(local_38->attach_routers).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(local_38->attach_routers).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 2);
  return;
}

Assistant:

NetworkLsa::NetworkLsa(std::istream& is) : Lsa(is)
{
    uint16_t len = tlen - sizeof(LsaHeader);
    uint8_t  arr[4];
    is.read((char*)&arr, 4);
    mask = arr2num(arr, 4);
    len  = len - 4;
    while (len != 0)
    {
        is.read((char*)&arr, 4);
        attach_routers.push_back(arr2num(arr, 4));
        len = len - 4;
    }
    attach_num = attach_routers.size();
}